

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall TypeFactory::clearCache(TypeFactory *this)

{
  int local_18;
  int local_14;
  int4 j;
  int4 i;
  TypeFactory *this_local;
  
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      this->typecache[local_14][local_18] = (Datatype *)0x0;
    }
  }
  this->typecache10 = (Datatype *)0x0;
  this->typecache16 = (Datatype *)0x0;
  this->type_nochar = (Datatype *)0x0;
  return;
}

Assistant:

void TypeFactory::clearCache(void)

{
  int4 i,j;
  for(i=0;i<9;++i)
    for(j=0;j<8;++j)
      typecache[i][j] = (Datatype *)0;
  typecache10 = (Datatype *)0;
  typecache16 = (Datatype *)0;
  type_nochar = (Datatype *)0;
}